

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_access_col_block(Integer s_a,Integer icol,void *idx,void *jdx,void *val)

{
  Integer proc;
  long *ptr;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *ptr_00;
  Integer hi;
  Integer lo;
  Integer ld;
  int64_t *tljdx;
  int64_t *tlidx;
  int *tjdx;
  int *tidx;
  char *lptr;
  Integer local_90;
  Integer local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar4 = s_a + 1000;
  lVar1 = SPA[lVar4].idx_size;
  lVar2 = 0;
  lVar5 = SPA[lVar4].nblocks;
  if (SPA[lVar4].nblocks < 1) {
    lVar5 = lVar2;
  }
  lVar3 = 0;
  while( true ) {
    if (lVar5 == lVar3) {
      *(undefined8 *)idx = 0;
      *(undefined8 *)jdx = 0;
      *(undefined8 *)val = 0;
      return;
    }
    if (SPA[lVar4].blkidx[lVar3] == icol) break;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x100000000;
  }
  local_80 = (long *)idx;
  local_78 = (long *)jdx;
  local_70 = (long *)val;
  proc = pnga_pgroup_nodeid(SPA[lVar4].grp);
  lVar5 = SPA[lVar4].offset[lVar3];
  local_40 = lVar1;
  pnga_distribution(SPA[lVar4].g_data,proc,&local_88,&local_90);
  pnga_access_ptr(SPA[lVar4].g_data,&local_88,&local_90,&local_38,&local_68);
  pnga_distribution(SPA[lVar4].g_i,proc,&local_88,&local_90);
  ptr = &local_48;
  if (lVar1 == 8) {
    ptr = &local_58;
  }
  ptr_00 = &local_50;
  if (lVar1 == 8) {
    ptr_00 = &local_60;
  }
  pnga_access_ptr(SPA[lVar4].g_i,&local_88,&local_90,ptr,&local_68);
  pnga_distribution(SPA[lVar4].g_j,proc,&local_88,&local_90);
  pnga_access_ptr(SPA[lVar4].g_j,&local_88,&local_90,ptr_00,&local_68);
  local_68 = (SPA[lVar4].ihi - SPA[lVar4].ilo) + 2;
  local_38 = SPA[lVar4].size * lVar5 + local_38;
  if (local_40 == 8) {
    lVar5 = lVar5 * 8 + local_60;
    lVar1 = local_68 * lVar3 * 8 + local_58;
    local_60 = lVar5;
    local_58 = lVar1;
  }
  else {
    lVar5 = (long)(int)lVar5 * 4 + local_50;
    lVar1 = (lVar2 * local_68 >> 0x1e) + local_48;
    local_50 = lVar5;
    local_48 = lVar1;
  }
  *local_80 = lVar1;
  *local_78 = lVar5;
  *local_70 = local_38;
  pnga_release(SPA[lVar4].g_data,&local_88,&local_90);
  pnga_release(SPA[lVar4].g_i,&local_88,&local_90);
  pnga_release(SPA[lVar4].g_j,&local_88,&local_90);
  return;
}

Assistant:

void pnga_sprs_array_access_col_block(Integer s_a, Integer icol,
    void *idx, void *jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  char *lptr;
  Integer i,index;
  Integer longidx;
  if (SPA[hdl].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  index = -1;
  for (i=0; i<SPA[hdl].nblocks; i++) {
    if (SPA[hdl].blkidx[i] == icol) {
      index = i;
      break;
    }
  }
  if (index == -1) {
    if (longidx) {
      *(int**)idx = NULL;
      *(int**)jdx = NULL;
    } else {
      *(int64_t**)idx = NULL;
      *(int64_t**)jdx = NULL;
    }
    *(char**)val = NULL;
  }  else {
    int *tidx;
    int *tjdx;
    int64_t *tlidx;
    int64_t *tljdx;
    char *lptr;
    Integer lo, hi, ld;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
    Integer offset = SPA[hdl].offset[index];

    /* access local portions of GAs containing data */
    pnga_distribution(SPA[hdl].g_data,me,&lo,&hi);
    pnga_access_ptr(SPA[hdl].g_data,&lo,&hi,&lptr,&ld);
    pnga_distribution(SPA[hdl].g_i,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tlidx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_i,&lo,&hi,&tidx,&ld);
    }
    pnga_distribution(SPA[hdl].g_j,me,&lo,&hi);
    if (longidx) {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tljdx,&ld);
    } else {
      pnga_access_ptr(SPA[hdl].g_j,&lo,&hi,&tjdx,&ld);
    }
    /* shift pointers to correct location */
    ld = SPA[hdl].ihi - SPA[hdl].ilo + 2;
    lptr = lptr + offset*SPA[hdl].size;
    if (longidx) {
      tljdx = tljdx + (int64_t)offset;
      tlidx = tlidx + (int64_t)(ld*index);
      *(int64_t**)idx = tlidx;
      *(int64_t**)jdx = tljdx;
    } else {
      tjdx = tjdx + (int)offset;
      tidx = tidx + (int)(ld*index);
      *(int**)idx = tidx;
      *(int**)jdx = tjdx;
    }
    *(char**)val = lptr;
    pnga_release(SPA[hdl].g_data,&lo,&hi);
    pnga_release(SPA[hdl].g_i,&lo,&hi);
    pnga_release(SPA[hdl].g_j,&lo,&hi);
  }
}